

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdArgs.cpp
# Opt level: O0

void __thiscall asl::CmdArgs::parse(CmdArgs *this,int argc,char **argv,String *spec)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  EnumWrapper<const_asl::Array<asl::String>_> *pEVar5;
  String *pSVar6;
  char *pcVar7;
  String *pSVar8;
  Array<asl::String> *this_00;
  Array<asl::String> *e;
  bool local_202;
  bool local_1f2;
  bool local_1c9;
  undefined1 local_e8 [7];
  bool nextIsOption;
  String opt;
  undefined1 local_c8 [3];
  bool isflag;
  int i_1;
  String *local_b0;
  String *s;
  EnumWrapper_ *local_90;
  EnumWrapper_ *_b_;
  undefined1 local_70 [8];
  Array<asl::String> parts;
  Array<asl::String> options;
  Array<asl::String> flags;
  String local_48;
  int local_30;
  int local_2c;
  int i;
  int n;
  String *spec_local;
  char **argv_local;
  CmdArgs *pCStack_10;
  int argc_local;
  CmdArgs *this_local;
  
  local_2c = argc;
  if (argc < 1) {
    local_2c = -argc;
  }
  _i = spec;
  spec_local = (String *)argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
    asl::String::String(&local_48,*(char **)(&spec_local->_size + (long)local_30 * 2));
    Array<asl::String>::operator<<(&this->_args,&local_48);
    asl::String::~String(&local_48);
  }
  Array<asl::String>::Array(&options);
  Array<asl::String>::Array(&parts);
  pSVar6 = _i;
  asl::String::String((String *)&_b_,',');
  asl::String::split((String *)local_70,pSVar6);
  asl::String::~String((String *)&_b_);
  newEnumerator<asl::Array<asl::String>>
            ((EnumWrapper<asl::Array<asl::String>_> *)&s,(asl *)local_70,e);
  local_90 = (EnumWrapper_ *)&s;
  while( true ) {
    pEVar5 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_90);
    bVar2 = EnumWrapper::operator_cast_to_bool((EnumWrapper *)pEVar5);
    bVar3 = false;
    if (bVar2) {
      bVar3 = local_90->more != 0;
    }
    if (!bVar3) break;
    pEVar5 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_90);
    local_b0 = Array<asl::String>::Enumerator::operator*((Enumerator *)(pEVar5 + 8));
    while (local_90->more != 0) {
      bVar3 = asl::String::contains(local_b0,':');
      pSVar6 = local_b0;
      if (bVar3) {
        iVar4 = asl::String::indexOf(local_b0,':',0);
        asl::String::substring((String *)local_c8,pSVar6,0,iVar4);
        Array<asl::String>::operator<<(&parts,(String *)local_c8);
        asl::String::~String((String *)local_c8);
      }
      else {
        Array<asl::String>::operator<<(&options,local_b0);
      }
      local_90->more = 0;
    }
    pEVar5 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_90);
    Array<asl::String>::Enumerator::operator++((Enumerator *)(pEVar5 + 8));
    local_90->more = 1 - local_90->more;
  }
  for (opt.field_2._12_4_ = 1; uVar1 = opt.field_2._12_4_,
      iVar4 = Array<asl::String>::length(&this->_args), (int)uVar1 < iVar4;
      opt.field_2._12_4_ = opt.field_2._12_4_ + 1) {
    pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_);
    bVar3 = asl::String::startsWith(pSVar6,'-');
    if (bVar3) {
      pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_);
      pcVar7 = asl::String::operator[](pSVar6,1);
      bVar3 = myisalnum(*pcVar7);
      if (!bVar3) goto LAB_0016f8be;
LAB_0016f95e:
      pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_);
      opt.field_2._space[0xb] = asl::String::endsWith(pSVar6,'!');
      pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_);
      pSVar8 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_);
      iVar4 = asl::String::length(pSVar8);
      asl::String::substring
                ((String *)local_e8,pSVar6,1,iVar4 - ((byte)opt.field_2._space[0xb] & 1));
      bVar3 = Array<asl::String>::contains(&this->_unused,(String *)local_e8);
      if (!bVar3) {
        Array<asl::String>::operator<<(&this->_unused,(String *)local_e8);
      }
      uVar1 = opt.field_2._12_4_;
      iVar4 = Array<asl::String>::length(&this->_args);
      local_1c9 = false;
      if ((int)uVar1 < iVar4 + -1) {
        pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_ + 1);
        bVar3 = asl::String::startsWith(pSVar6,'-');
        if (bVar3) {
          pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_ + 1);
          pcVar7 = asl::String::operator[](pSVar6,1);
          bVar3 = myisalpha(*pcVar7);
          local_1f2 = true;
          if (!bVar3) goto LAB_0016fb61;
        }
        else {
LAB_0016fb61:
          pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_ + 1);
          bVar3 = asl::String::startsWith(pSVar6,"--");
          local_202 = false;
          if (bVar3) {
            pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_ + 1);
            pcVar7 = asl::String::operator[](pSVar6,2);
            local_202 = myisalpha(*pcVar7);
          }
          local_1f2 = local_202;
        }
        local_1c9 = local_1f2;
      }
      uVar1 = opt.field_2._12_4_;
      iVar4 = Array<asl::String>::length(&this->_args);
      if ((((iVar4 + -1 <= (int)uVar1) || (local_1c9 != false)) ||
          (bVar3 = Array<asl::String>::contains(&options,(String *)local_e8), bVar3)) ||
         ((opt.field_2._space[0xb] & 1U) != 0)) {
        if (((opt.field_2._space[0xb] & 1U) != 0) ||
           (bVar3 = Array<asl::String>::contains(&parts,(String *)local_e8), !bVar3)) {
          pSVar6 = Map<asl::String,_asl::String>::operator[]
                             (&(this->_opts).super_Map<asl::String,_asl::String>,(String *)local_e8)
          ;
          asl::String::operator=(pSVar6,"1");
          goto LAB_0016fdd0;
        }
        bVar3 = true;
      }
      else {
        this_00 = Map<asl::String,_asl::Array<asl::String>_>::operator[]
                            (&(this->_multi).super_Map<asl::String,_asl::Array<asl::String>_>,
                             (String *)local_e8);
        pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_ + 1);
        Array<asl::String>::operator<<(this_00,pSVar6);
        pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_ + 1);
        pSVar8 = Map<asl::String,_asl::String>::operator[]
                           (&(this->_opts).super_Map<asl::String,_asl::String>,(String *)local_e8);
        asl::String::operator=(pSVar8,pSVar6);
        opt.field_2._12_4_ = opt.field_2._12_4_ + 1;
LAB_0016fdd0:
        bVar3 = false;
      }
      asl::String::~String((String *)local_e8);
      if (bVar3) break;
    }
    else {
LAB_0016f8be:
      pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_);
      bVar3 = asl::String::startsWith(pSVar6,"--");
      if (bVar3) {
        pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_);
        pcVar7 = asl::String::operator[](pSVar6,2);
        bVar3 = myisalnum(*pcVar7);
        if (bVar3) goto LAB_0016f95e;
      }
      pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_);
      bVar3 = asl::String::operator!=(pSVar6,'-');
      if (bVar3) {
        pSVar6 = Array<asl::String>::operator[](&this->_args,opt.field_2._12_4_);
        Array<asl::String>::operator<<(&this->_rest,pSVar6);
      }
    }
  }
  Array<asl::String>::~Array((Array<asl::String> *)local_70);
  Array<asl::String>::~Array(&parts);
  Array<asl::String>::~Array(&options);
  return;
}

Assistant:

void CmdArgs::parse(int argc, char* argv[], const String& spec)
{
	int n = abs(argc);
	for (int i = 0; i < n; i++)
	{
#ifdef _WIN32
		_args << ((argc < 0) ? String(argv[i]) : String::fromLocal(argv[i]));
#else
		_args << argv[i];
#endif
	}
	Array<String> flags;
	Array<String> options;
	Array<String> parts = spec.split(',');
	foreach(const String & s, parts)
	{
		if (s.contains(':'))
			options << s.substring(0, s.indexOf(':'));
		else
			flags << s;
	}
	for (int i = 1; i < _args.length(); i++)
	{
		if ((_args[i].startsWith('-') && myisalnum(_args[i][1])) || (_args[i].startsWith("--") && myisalnum(_args[i][2])))
		{
			bool isflag = _args[i].endsWith('!');
			String opt = _args[i].substring(1, _args[i].length() - (isflag ? 1 : 0));
			if (!_unused.contains(opt))
				_unused << opt;
			bool nextIsOption = i < _args.length() - 1 && ((_args[i + 1].startsWith('-') && myisalpha(_args[i + 1][1])) || (_args[i + 1].startsWith("--") && myisalpha(_args[i + 1][2])));
			if ((i < _args.length() - 1 && !nextIsOption) && !flags.contains(opt) && !isflag)
			{
				_multi[opt] << _args[i + 1];
				_opts[opt] = _args[i + 1];
				i++;
			}
			else if (isflag || !options.contains(opt))
			{
				_opts[opt] = "1";
			}
			else // option without value!
				return;
		}
		else if (_args[i] != '-')
			_rest << _args[i];
	}
}